

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O1

TransliteratorEntry * __thiscall
icu_63::TransliteratorRegistry::find
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant)

{
  short sVar1;
  int iVar2;
  undefined4 uVar3;
  TransliteratorEntry *pTVar4;
  UnicodeString ID;
  TransliteratorSpec trg;
  TransliteratorSpec src;
  UnicodeString local_2e0;
  UnicodeString local_2a0;
  TransliteratorSpec local_260;
  TransliteratorSpec local_148;
  
  TransliteratorSpec::TransliteratorSpec(&local_148,source);
  TransliteratorSpec::TransliteratorSpec(&local_260,target);
  local_2a0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_2a0.fUnion.fStackFields.fLengthAndFlags = 2;
  TransliteratorIDParser::STVtoID(source,target,variant,&local_2a0);
  pTVar4 = (TransliteratorEntry *)uhash_get_63((this->registry).hash,&local_2a0);
  if (pTVar4 == (TransliteratorEntry *)0x0) {
    sVar1 = (variant->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (variant->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if ((iVar2 == 0) ||
       ((pTVar4 = findInDynamicStore(this,&local_148,&local_260,variant),
        pTVar4 == (TransliteratorEntry *)0x0 &&
        (pTVar4 = findInStaticStore(this,&local_148,&local_260,variant),
        pTVar4 == (TransliteratorEntry *)0x0)))) {
      while( true ) {
        TransliteratorSpec::reset(&local_148);
        while( true ) {
          local_2e0.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_0048be70;
          local_2e0.fUnion.fStackFields.fLengthAndFlags = 2;
          pTVar4 = findInDynamicStore(this,&local_148,&local_260,&local_2e0);
          icu_63::UnicodeString::~UnicodeString(&local_2e0);
          if (pTVar4 != (TransliteratorEntry *)0x0) goto LAB_0027abc2;
          local_2e0.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_0048be70;
          local_2e0.fUnion.fStackFields.fLengthAndFlags = 2;
          pTVar4 = findInStaticStore(this,&local_148,&local_260,&local_2e0);
          icu_63::UnicodeString::~UnicodeString(&local_2e0);
          if (pTVar4 != (TransliteratorEntry *)0x0) goto LAB_0027abc2;
          uVar3 = local_148.nextSpec.fUnion.fFields.fLength;
          if (-1 < local_148.nextSpec.fUnion.fStackFields.fLengthAndFlags) {
            uVar3 = (int)local_148.nextSpec.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (uVar3 == 0) break;
          icu_63::UnicodeString::operator=(&local_148.spec,&local_148.nextSpec);
          local_148.isSpecLocale = local_148.isNextLocale;
          TransliteratorSpec::setupNext(&local_148);
        }
        uVar3 = local_260.nextSpec.fUnion.fFields.fLength;
        if (-1 < local_260.nextSpec.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)local_260.nextSpec.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (uVar3 == 0) break;
        icu_63::UnicodeString::operator=(&local_260.spec,&local_260.nextSpec);
        local_260.isSpecLocale = local_260.isNextLocale;
        TransliteratorSpec::setupNext(&local_260);
      }
      pTVar4 = (TransliteratorEntry *)0x0;
    }
  }
LAB_0027abc2:
  icu_63::UnicodeString::~UnicodeString(&local_2a0);
  TransliteratorSpec::~TransliteratorSpec(&local_260);
  TransliteratorSpec::~TransliteratorSpec(&local_148);
  return pTVar4;
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::find(UnicodeString& source,
                                    UnicodeString& target,
                                    UnicodeString& variant) {
    
    TransliteratorSpec src(source);
    TransliteratorSpec trg(target);
    TransliteratorEntry* entry;

    // Seek exact match in hashtable.  Temporary fix for ICU 4.6.
    // TODO: The general logic for finding a matching transliterator needs to be reviewed.
    // ICU ticket #8089
    UnicodeString ID;
    TransliteratorIDParser::STVtoID(source, target, variant, ID);
    entry = (TransliteratorEntry*) registry.get(ID);
    if (entry != 0) {
        // std::string ss;
        // std::cout << ID.toUTF8String(ss) << std::endl;
        return entry;
    }

    if (variant.length() != 0) {
        
        // Seek exact match in hashtable
        entry = findInDynamicStore(src, trg, variant);
        if (entry != 0) {
            return entry;
        }
        
        // Seek exact match in locale resources
        entry = findInStaticStore(src, trg, variant);
        if (entry != 0) {
            return entry;
        }
    }

    for (;;) {
        src.reset();
        for (;;) {
            // Seek match in hashtable
            entry = findInDynamicStore(src, trg, NO_VARIANT);
            if (entry != 0) {
                return entry;
            }
            
            // Seek match in locale resources
            entry = findInStaticStore(src, trg, NO_VARIANT);
            if (entry != 0) {
                return entry;
            }
            if (!src.hasFallback()) {
                break;
            }
            src.next();
        }
        if (!trg.hasFallback()) {
            break;
        }
        trg.next();
    }

    return 0;
}